

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::ReverseCopyProp(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  undefined2 valueType;
  StackSym *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  uint sourceContextId;
  uint functionId;
  BOOL BVar6;
  uint32 uVar7;
  BVIndex BVar8;
  BailOutKind BVar9;
  RegOpnd *pRVar10;
  Instr *this_00;
  StackSym *this_01;
  BailOutInfo *pBVar11;
  RegOpnd *pRVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  Type *pTVar14;
  ByteCodeUsesInstr *pBVar15;
  Opnd *this_02;
  Iterator local_68;
  undefined4 *local_58;
  RegOpnd *local_50;
  ByteCodeUsesInstr *local_48;
  StackSym *local_40;
  StackSym *local_38;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ReverseCopyPropPhase,sourceContextId,functionId);
  if (bVar4) {
    return false;
  }
  if (this->tag != DeadStorePhase) {
    return false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if (this->isCollectionPass != false) {
    return false;
  }
  BVar6 = Func::HasTry(this->func);
  if (BVar6 != 0) {
    return false;
  }
  if ((instr->m_opcode != Ld_I4) && (instr->m_opcode != Ld_A)) {
    return false;
  }
  bVar4 = IR::Opnd::IsRegOpnd(instr->m_dst);
  if (!bVar4) {
    return false;
  }
  bVar4 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (!bVar4) {
    return false;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    return false;
  }
  local_50 = IR::Opnd::AsRegOpnd(instr->m_dst);
  pRVar10 = IR::Opnd::AsRegOpnd(instr->m_src1);
  this_00 = IR::Instr::GetPrevRealInstrOrLabel(instr);
  this_01 = pRVar10->m_sym;
  if ((this_01->field_0x1a & 1) != 0) {
    this_01 = StackSym::GetVarEquivSym(this_01,this->func);
  }
  this_02 = this_00->m_dst;
  if (this_02 == (Opnd *)0x0) {
    if (this_00->m_opcode != ByteCodeUses) {
      return false;
    }
    local_48 = IR::Instr::AsByteCodeUsesInstr(this_00);
    pBVar13 = IR::ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed(local_48);
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return false;
    }
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar13,(this_01->super_Sym).m_id);
    if (BVar5 == '\0') {
      return false;
    }
    BVar8 = BVSparse<Memory::JitArenaAllocator>::Count(pBVar13);
    pBVar15 = local_48;
    if (BVar8 != 1) {
      return false;
    }
    this_00 = IR::Instr::GetPrevRealInstrOrLabel(&local_48->super_Instr);
    this_02 = this_00->m_dst;
    if (this_02 == (Opnd *)0x0) {
      return false;
    }
  }
  else {
    pBVar15 = (ByteCodeUsesInstr *)0x0;
  }
  OVar1 = this_00->m_opcode;
  if (OVar1 == LdElemI_A) {
    return false;
  }
  if (OVar1 == IsInst) {
    return false;
  }
  if (OVar1 == ByteCodeUses) {
    return false;
  }
  local_48 = pBVar15;
  if ((this_00->field_0x38 & 0x10) != 0) {
    uVar7 = IR::Instr::GetByteCodeOffset(this_00);
    local_40 = (StackSym *)CONCAT44(local_40._4_4_,uVar7);
    pBVar11 = IR::Instr::GetBailOutInfo(this_00);
    if ((uint32)local_40 != pBVar11->bailOutOffset) {
      return false;
    }
    this_02 = this_00->m_dst;
  }
  bVar4 = IR::Opnd::IsEqual(this_02,&pRVar10->super_Opnd);
  if ((((bVar4) &&
       (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->currentBlock->upwardExposedUses,(pRVar10->m_sym->super_Sym).m_id),
       BVar5 == '\0')) &&
      ((pBVar13 = this->currentBlock->byteCodeUpwardExposedUsed,
       pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0 ||
       (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar13,(this_01->super_Sym).m_id),
       BVar5 == '\0')))) && (bVar4 = DoDeadStore(this->func,pRVar10->m_sym), bVar4)) {
    if ((((this_00->field_0x38 & 0x10) != 0) &&
        (local_40 = local_50->m_sym, local_40->m_type == TyInt32)) &&
       ((local_40->field_0x1a & 1) != 0)) {
      local_38 = IR::RegOpnd::TryGetStackSym(this_00->m_dst);
      BVar9 = IR::Instr::GetBailOutKind(this_00);
      if (((local_38 != (StackSym *)0x0) && ((BVar9 & BailOutOnResultConditions) != BailOutInvalid))
         && ((((local_38->m_type == TyInt32 &&
               (((local_38->field_0x1a & 1) != 0 && (this_00->m_src1 != (Opnd *)0x0)))) &&
              (bVar4 = IR::Opnd::IsEqual(this_00->m_dst,this_00->m_src1), !bVar4)) &&
             ((this_00->m_src2 == (Opnd *)0x0 ||
              (bVar4 = IR::Opnd::IsEqual(this_00->m_dst,this_00->m_src2), !bVar4)))))) {
        pBVar11 = IR::Instr::GetBailOutInfo(this_00);
        local_68.list = &pBVar11->usedCapturedValues->copyPropSyms;
        local_68.current = &(local_68.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        local_38 = (StackSym *)local_68.list;
        local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        while( true ) {
          if (local_38 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_58 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *local_58 = 0;
            local_38 = (StackSym *)local_68.current;
          }
          pSVar2 = (StackSym *)(local_38->super_Sym)._vptr_Sym;
          if (pSVar2 == (StackSym *)local_68.list) break;
          local_68.current = (NodeBase *)pSVar2;
          pTVar14 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data(&local_68);
          if (local_40 == pTVar14->value) {
            return false;
          }
          local_38 = (StackSym *)local_68.current;
        }
      }
    }
    if (local_48 == (ByteCodeUsesInstr *)0x0) {
      pRVar12 = IR::Opnd::AsRegOpnd(this_00->m_dst);
      if (((((pRVar12->super_Opnd).field_0xb & 8) != 0) &&
          (((pRVar10->super_Opnd).field_0xb & 8) == 0)) && ((this_01->field_0x19 & 0x20) != 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->byteCodeUpwardExposedUsed,(this_01->super_Sym).m_id);
      }
    }
    else {
      if (((this->currentBlock->byteCodeUpwardExposedUsed !=
            (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
          (pRVar12 = IR::Opnd::AsRegOpnd(this_00->m_dst), ((pRVar12->super_Opnd).field_0xb & 8) != 0
          )) && ((this_01->field_0x19 & 0x20) != 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->byteCodeUpwardExposedUsed,(this_01->super_Sym).m_id);
        bVar4 = IR::Opnd::IsEqual(&pRVar10->super_Opnd,&local_50->super_Opnd);
        if ((bVar4) && ((this_00->m_dst->field_0xb & 8) != 0)) {
          IR::Opnd::SetIsJITOptimizedReg(&local_50->super_Opnd,true);
        }
      }
      IR::Instr::Remove(&local_48->super_Instr);
    }
    bVar4 = DoMarkTempObjectVerify(this);
    if (bVar4) {
      ObjectTempVerify::NotifyReverseCopyProp
                (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,this_00);
    }
    pRVar10 = local_50;
    valueType = this_00->m_dst->m_valueType;
    IR::Opnd::SetValueType(&local_50->super_Opnd,(ValueType)valueType);
    IR::Instr::ReplaceDst(this_00,&pRVar10->super_Opnd);
    IR::Instr::Remove(instr);
    return true;
  }
  return false;
}

Assistant:

bool
BackwardPass::ReverseCopyProp(IR::Instr *instr)
{
    // Look for :
    //
    //  t1 = instr
    //       [bytecodeuse t1]
    //  t2 = Ld_A t1            >> t1 !upwardExposed
    //
    // Transform into:
    //
    //  t2 = instr
    //
    if (PHASE_OFF(Js::ReverseCopyPropPhase, this->func))
    {
        return false;
    }
    if (this->tag != Js::DeadStorePhase || this->IsPrePass() || this->IsCollectionPass())
    {
        return false;
    }
    if (this->func->HasTry())
    {
        // UpwardExposedUsed info can't be relied on
        return false;
    }

    // Find t2 = Ld_A t1
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
        break;

    default:
        return false;
    }

    if (!instr->GetDst()->IsRegOpnd())
    {
        return false;
    }
    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    if (instr->HasBailOutInfo())
    {
        return false;
    }

    IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
    IR::Instr *instrPrev = instr->GetPrevRealInstrOrLabel();

    IR::ByteCodeUsesInstr *byteCodeUseInstr = nullptr;
    StackSym *varSym = src->m_sym;

    if (varSym->IsTypeSpec())
    {
        varSym = varSym->GetVarEquivSym(this->func);
    }

    // SKip ByteCodeUse instr if possible
    //       [bytecodeuse t1]
    if (!instrPrev->GetDst())
    {
        if (instrPrev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            byteCodeUseInstr = instrPrev->AsByteCodeUsesInstr();
            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = byteCodeUseInstr->GetByteCodeUpwardExposedUsed();
            if (byteCodeUpwardExposedUsed && byteCodeUpwardExposedUsed->Test(varSym->m_id) && byteCodeUpwardExposedUsed->Count() == 1)
            {
                instrPrev = byteCodeUseInstr->GetPrevRealInstrOrLabel();

                if (!instrPrev->GetDst())
                {
                    return false;
                }
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    // The fast-path for these doesn't handle dst == src.
    // REVIEW: I believe the fast-path for LdElemI_A has been fixed... Nope, still broken for "i = A[i]" for prejit
    switch (instrPrev->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::IsInst:
    case Js::OpCode::ByteCodeUses:
        return false;
    }

    // Can't do it if post-op bailout would need result
    // REVIEW: enable for pre-opt bailout?
    if (instrPrev->HasBailOutInfo() && instrPrev->GetByteCodeOffset() != instrPrev->GetBailOutInfo()->bailOutOffset)
    {
        return false;
    }

    // Make sure src of Ld_A == dst of instr
    //  t1 = instr
    if (!instrPrev->GetDst()->IsEqual(src))
    {
        return false;
    }

    // Make sure t1 isn't used later
    if (this->currentBlock->upwardExposedUses->Test(src->m_sym->m_id))
    {
        return false;
    }

    if (this->currentBlock->byteCodeUpwardExposedUsed && this->currentBlock->byteCodeUpwardExposedUsed->Test(varSym->m_id))
    {
        return false;
    }

    // Make sure we can dead-store this sym (debugger mode?)
    if (!this->DoDeadStore(this->func, src->m_sym))
    {
        return false;
    }

    StackSym *const dstSym = dst->m_sym;
    if(instrPrev->HasBailOutInfo() && dstSym->IsInt32() && dstSym->IsTypeSpec())
    {
        StackSym *const prevDstSym = IR::RegOpnd::TryGetStackSym(instrPrev->GetDst());
        if(instrPrev->GetBailOutKind() & IR::BailOutOnResultConditions &&
            prevDstSym &&
            prevDstSym->IsInt32() &&
            prevDstSym->IsTypeSpec() &&
            instrPrev->GetSrc1() &&
            !instrPrev->GetDst()->IsEqual(instrPrev->GetSrc1()) &&
            !(instrPrev->GetSrc2() && instrPrev->GetDst()->IsEqual(instrPrev->GetSrc2())))
        {
            // The previous instruction's dst value may be trashed by the time of the pre-op bailout. Skip reverse copy-prop if
            // it would replace the previous instruction's dst with a sym that bailout had decided to use to restore a value for
            // the pre-op bailout, which can't be trashed before bailout. See big comment in ProcessBailOutCopyProps for the
            // reasoning behind the tests above.
            FOREACH_SLISTBASE_ENTRY(
                CopyPropSyms,
                usedCopyPropSym,
                &instrPrev->GetBailOutInfo()->usedCapturedValues->copyPropSyms)
            {
                if(dstSym == usedCopyPropSym.Value())
                {
                    return false;
                }
            } NEXT_SLISTBASE_ENTRY;
        }
    }

    if (byteCodeUseInstr)
    {
        if (this->currentBlock->byteCodeUpwardExposedUsed && instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
        {
            if(varSym->HasByteCodeRegSlot())
            {
                this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
            }

            if (src->IsEqual(dst) && instrPrev->GetDst()->GetIsJITOptimizedReg())
            {
                //      s2(s1).i32     =  FromVar        s1.var      #0000  Bailout: #0000 (BailOutIntOnly)
                //                        ByteCodeUses   s1
                //      s2(s1).i32     =  Ld_A           s2(s1).i32
                //
                // Since the dst on the FromVar is marked JITOptimized, we need to set it on the new dst as well,
                // or we'll change the bytecode liveness of s1

                dst->SetIsJITOptimizedReg(true);
            }
        }
        byteCodeUseInstr->Remove();
    }
    else if (instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && !src->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
    {
        this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyReverseCopyProp(instrPrev);
    }
#endif

    dst->SetValueType(instrPrev->GetDst()->GetValueType());
    instrPrev->ReplaceDst(dst);

    instr->Remove();

    return true;
}